

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O1

FT_Error FT_New_GlyphSlot(FT_Face face,FT_GlyphSlot *aslot)

{
  FT_Driver pFVar1;
  FT_Memory pFVar2;
  size_t __n;
  FT_Driver_Class pFVar3;
  FT_Memory pFVar4;
  FT_Slot_InitFunc p_Var5;
  FT_GlyphSlot slot;
  FT_Slot_Internal pFVar6;
  FT_GlyphLoader __s;
  int iVar7;
  
  if (face == (FT_Face)0x0) {
    iVar7 = 0x23;
  }
  else {
    pFVar1 = face->driver;
    if (pFVar1 == (FT_Driver)0x0) {
      iVar7 = 6;
    }
    else {
      pFVar2 = (pFVar1->root).memory;
      __n = pFVar1->clazz->slot_object_size;
      if ((long)__n < 1) {
        slot = (FT_GlyphSlot)0x0;
        iVar7 = 6;
        if (__n == 0) {
          iVar7 = 0;
        }
      }
      else {
        slot = (FT_GlyphSlot)(*pFVar2->alloc)(pFVar2,__n);
        iVar7 = (uint)(slot == (FT_GlyphSlot)0x0) << 6;
      }
      if ((0 < (long)__n) && (iVar7 == 0)) {
        memset(slot,0,__n);
      }
      if (iVar7 == 0) {
        slot->face = face;
        pFVar1 = face->driver;
        pFVar3 = pFVar1->clazz;
        pFVar4 = (pFVar1->root).memory;
        slot->library = (pFVar1->root).library;
        pFVar6 = (FT_Slot_Internal)(*pFVar4->alloc)(pFVar4,0x48);
        iVar7 = (uint)(pFVar6 == (FT_Slot_Internal)0x0) << 6;
        if (pFVar6 != (FT_Slot_Internal)0x0) {
          (pFVar6->glyph_delta).x = 0;
          (pFVar6->glyph_delta).y = 0;
          (pFVar6->glyph_matrix).yx = 0;
          (pFVar6->glyph_matrix).yy = 0;
          (pFVar6->glyph_matrix).xx = 0;
          (pFVar6->glyph_matrix).xy = 0;
          pFVar6->loader = (FT_GlyphLoader)0x0;
          pFVar6->flags = 0;
          pFVar6->glyph_transformed = '\0';
          *(undefined3 *)&pFVar6->field_0xd = 0;
          pFVar6->glyph_hints = (void *)0x0;
          slot->internal = pFVar6;
          if ((((pFVar1->root).clazz)->module_flags & 0x200) == 0) {
            __s = (FT_GlyphLoader)(*pFVar4->alloc)(pFVar4,0xb0);
            if (__s == (FT_GlyphLoader)0x0) {
              iVar7 = 0x40;
            }
            else {
              iVar7 = 0;
              memset(__s,0,0xb0);
              __s->memory = pFVar4;
              pFVar6->loader = __s;
            }
          }
          if ((iVar7 == 0) && (p_Var5 = pFVar3->init_slot, p_Var5 != (FT_Slot_InitFunc)0x0)) {
            iVar7 = (*p_Var5)(slot);
          }
        }
        if (iVar7 == 0) {
          slot->next = face->glyph;
          face->glyph = slot;
          if (aslot != (FT_GlyphSlot *)0x0) {
            *aslot = slot;
          }
        }
        else {
          ft_glyphslot_done(slot);
          (*pFVar2->free)(pFVar2,slot);
        }
      }
      else if (aslot != (FT_GlyphSlot *)0x0) {
        *aslot = (FT_GlyphSlot)0x0;
      }
    }
  }
  return iVar7;
}

Assistant:

FT_BASE_DEF( FT_Error )
  FT_New_GlyphSlot( FT_Face        face,
                    FT_GlyphSlot  *aslot )
  {
    FT_Error         error;
    FT_Driver        driver;
    FT_Driver_Class  clazz;
    FT_Memory        memory;
    FT_GlyphSlot     slot = NULL;


    if ( !face )
      return FT_THROW( Invalid_Face_Handle );

    if ( !face->driver )
      return FT_THROW( Invalid_Argument );

    driver = face->driver;
    clazz  = driver->clazz;
    memory = driver->root.memory;

    FT_TRACE4(( "FT_New_GlyphSlot: Creating new slot object\n" ));
    if ( !FT_ALLOC( slot, clazz->slot_object_size ) )
    {
      slot->face = face;

      error = ft_glyphslot_init( slot );
      if ( error )
      {
        ft_glyphslot_done( slot );
        FT_FREE( slot );
        goto Exit;
      }

      slot->next  = face->glyph;
      face->glyph = slot;

      if ( aslot )
        *aslot = slot;
    }
    else if ( aslot )
      *aslot = NULL;


  Exit:
    FT_TRACE4(( "FT_New_GlyphSlot: Return 0x%x\n", error ));

    return error;
  }